

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

string_view __thiscall slang::SourceManager::getRawFileName(SourceManager *this,BufferID buffer)

{
  FileData *pFVar1;
  FileInfo *pFVar2;
  char *pcVar3;
  size_type sVar4;
  string_view sVar5;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  pFVar2 = getFileInfo<std::shared_lock<std::shared_mutex>_>(this,buffer,&local_28);
  pcVar3 = "";
  if ((pFVar2 == (FileInfo *)0x0) || (pFVar1 = pFVar2->data, pFVar1 == (FileData *)0x0)) {
    sVar4 = 0;
  }
  else {
    pcVar3 = (pFVar1->name)._M_dataplus._M_p;
    sVar4 = (pFVar1->name)._M_string_length;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  sVar5._M_str = pcVar3;
  sVar5._M_len = sVar4;
  return sVar5;
}

Assistant:

std::string_view SourceManager::getRawFileName(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info || !info->data)
        return "";

    return info->data->name;
}